

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

bool __thiscall QVLABase<QLocaleId>::contains<QLocaleId>(QVLABase<QLocaleId> *this,QLocaleId *t)

{
  long lVar1;
  bool bVar2;
  const_iterator pQVar3;
  QLocaleId *in_RSI;
  long in_FS_OFFSET;
  QLocaleId *i;
  QLocaleId *b;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  const_iterator local_40;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = begin((QVLABase<QLocaleId> *)0x147d8f);
  local_40 = end((QVLABase<QLocaleId> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  do {
    if (local_40 == pQVar3) {
      local_19 = false;
      goto LAB_00147e0d;
    }
    local_40 = local_40 + -1;
    bVar2 = QLocaleId::operator==(local_40,*in_RSI);
  } while (!bVar2);
  local_19 = true;
LAB_00147e0d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

Q_INLINE_TEMPLATE bool QVLABase<T>::contains(const AT &t) const
{
    const T *b = begin();
    const T *i = end();
    while (i != b) {
        if (*--i == t)
            return true;
    }
    return false;
}